

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O3

void duckdb::ConstantScanPartial<duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  uint64_t *puVar2;
  uhugeint_t uVar3;
  
  pdVar1 = result->data;
  uVar3 = NumericStats::GetMin<duckdb::uhugeint_t>(&(segment->stats).statistics);
  if (scan_count != 0) {
    puVar2 = (uint64_t *)(pdVar1 + result_offset * 0x10 + 8);
    do {
      puVar2[-1] = uVar3.lower;
      *puVar2 = uVar3.upper;
      puVar2 = puVar2 + 2;
      scan_count = scan_count - 1;
    } while (scan_count != 0);
  }
  return;
}

Assistant:

void ConstantScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                         idx_t result_offset) {
	ConstantFillFunction<T>(segment, result, result_offset, scan_count);
}